

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layers_unconditional_strided(fasthessian *fh)

{
  long lVar1;
  
  lVar1 = 1;
  do {
    compute_response_layer_unconditional_strided(fh->response_map[lVar1 + -1],fh->iimage);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  if (4 < fh->total_layers) {
    lVar1 = 4;
    do {
      compute_response_layer_unconditional(fh->response_map[lVar1],fh->iimage);
      lVar1 = lVar1 + 1;
    } while (lVar1 < fh->total_layers);
  }
  return;
}

Assistant:

void compute_response_layers_unconditional_strided(struct fasthessian* fh){

    for (int i = 0; i < 4; ++i) {
		compute_response_layer_unconditional_strided(fh->response_map[i], fh->iimage);
	}
    for (int i = 4; i < fh->total_layers; ++i) {
		compute_response_layer_unconditional(fh->response_map[i], fh->iimage);
	}
}